

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O3

double __thiscall
soplex::SPxScaler<double>::maxRowRatio(SPxScaler<double> *this,SPxLPBase<double> *lp)

{
  double dVar1;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  double dVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  Item *pIVar6;
  long in_FS_OFFSET;
  Real RVar7;
  double dVar8;
  double dVar9;
  double local_78;
  double local_70;
  double local_68;
  
  if ((lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum < 1) {
    local_78 = 0.0;
  }
  else {
    dVar1 = *(double *)(in_FS_OFFSET + -8);
    local_78 = 0.0;
    lVar5 = 0;
    do {
      pIVar6 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
               (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar5].idx;
      ::soplex::infinity::__tls_init();
      local_68 = dVar1;
      if ((pIVar6->data).super_SVectorBase<double>.memused < 1) {
        local_70 = 0.0;
      }
      else {
        local_70 = 0.0;
        lVar3 = 0;
        lVar4 = 0;
        do {
          dVar9 = *(double *)((long)&((pIVar6->data).super_SVectorBase<double>.m_elem)->val + lVar3)
          ;
          this_00 = (this->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          this_01 = (this->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
          }
          RVar7 = Tolerances::epsilon(this_00);
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
          dVar9 = ABS(dVar9);
          dVar2 = local_70;
          if (RVar7 < dVar9) {
            dVar8 = dVar9;
            if (local_68 <= dVar9) {
              dVar8 = local_68;
            }
            dVar2 = dVar9;
            local_68 = dVar8;
            if (dVar9 <= local_70) {
              dVar2 = local_70;
            }
          }
          local_70 = dVar2;
          lVar4 = lVar4 + 1;
          lVar3 = lVar3 + 0x10;
        } while (lVar4 < (pIVar6->data).super_SVectorBase<double>.memused);
      }
      ::soplex::infinity::__tls_init();
      if (((local_68 != dVar1) || (dVar9 = local_78, NAN(local_68) || NAN(dVar1))) &&
         (dVar9 = local_70 / local_68, local_70 / local_68 <= local_78)) {
        dVar9 = local_78;
      }
      local_78 = dVar9;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  return local_78;
}

Assistant:

R SPxScaler<R>::maxRowRatio(const SPxLPBase<R>& lp) const
{

   R pmax = 0.0;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& vec  = lp.rowVector(i);
      R           mini = R(infinity);
      R           maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         R x = spxAbs(vec.value(j));

         if(isZero(x, this->tolerances()->epsilon()))
            continue;

         if(x < mini)
            mini = x;

         if(x > maxi)
            maxi = x;
      }

      if(mini == R(infinity))
         continue;

      R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}